

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x1_010.c
# Opt level: O1

UINT8 device_start_x1_010(DEV_GEN_CFG *cfg,DEV_INFO *retDevInf)

{
  UINT32 UVar1;
  x1_010_state *info;
  DEV_DATA DVar2;
  UINT8 UVar3;
  uint uVar4;
  
  DVar2.chipInf = calloc(1,0x20b0);
  if (DVar2.chipInf == (void *)0x0) {
    UVar3 = 0xff;
  }
  else {
    uVar4 = cfg->clock;
    *(uint *)((long)DVar2.chipInf + 0x209c) = uVar4;
    uVar4 = uVar4 >> 9;
    *(uint *)&((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = uVar4;
    if ((cfg->srMode == '\x01') || ((cfg->srMode == '\x02' && (uVar4 < cfg->smplRate)))) {
      *(UINT32 *)&((DEV_DATA *)((long)DVar2.chipInf + 0x18))->chipInf = cfg->smplRate;
    }
    UVar3 = '\0';
    *(undefined4 *)&((DEV_DATA *)((long)DVar2.chipInf + 8))->chipInf = 0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x10))->chipInf = (void *)0x0;
    ((DEV_DATA *)((long)DVar2.chipInf + 0x20a0))->chipInf = (void *)0x0;
    *(undefined8 *)((long)DVar2.chipInf + 0x20a8) = 0;
    *(void **)DVar2.chipInf = DVar2.chipInf;
    UVar1 = *(UINT32 *)((long)DVar2.chipInf + 0x18);
    retDevInf->dataPtr = (DEV_DATA *)DVar2.chipInf;
    retDevInf->sampleRate = UVar1;
    retDevInf->devDef = &devDef;
    retDevInf->linkDevCount = 0;
    retDevInf->linkDevs = (DEVLINK_INFO *)0x0;
  }
  return UVar3;
}

Assistant:

static UINT8 device_start_x1_010(const DEV_GEN_CFG* cfg, DEV_INFO* retDevInf)
{
	x1_010_state *info;

	info = (x1_010_state *)calloc(1, sizeof(x1_010_state));
	if (info == NULL)
		return 0xFF;

	info->base_clock    = cfg->clock;
	info->rate          = info->base_clock / 512;
	SRATE_CUSTOM_HIGHEST(cfg->srMode, info->rate, cfg->smplRate);

	info->ROMSize       = 0x00;
	info->rom           = NULL;

	/* Print some more debug info */
	//LOG_SOUND(("masterclock = %d rate = %d\n", info->base_clock, info->rate ));

	x1_010_set_mute_mask(info, 0x0000);

	info->_devData.chipInf = info;
	INIT_DEVINF(retDevInf, &info->_devData, info->rate, &devDef);

	return 0x00;
}